

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pushdown_projection.cpp
# Opt level: O1

bool duckdb::IsVolatile(LogicalProjection *proj,
                       unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *expr)

{
  int iVar1;
  pointer pEVar2;
  BoundColumnRefExpression *pBVar3;
  reference this;
  type expr_00;
  bool is_volatile;
  undefined1 local_39;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expr);
  if ((pEVar2->super_BaseExpression).type == BOUND_COLUMN_REF) {
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(expr);
    pBVar3 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&pEVar2->super_BaseExpression);
    this = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](&(proj->super_LogicalOperator).expressions,(pBVar3->binding).column_index);
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this);
    iVar1 = (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[0xc])(pEVar2);
    return SUB41(iVar1,0);
  }
  local_39 = 0;
  expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                      (expr);
  pcStack_20 = ::std::
               _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/pushdown/pushdown_projection.cpp:24:13)>
               ::_M_invoke;
  local_28 = ::std::
             _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/pushdown/pushdown_projection.cpp:24:13)>
             ::_M_manager;
  local_38._M_unused._M_object = &local_39;
  local_38._8_8_ = proj;
  ExpressionIterator::EnumerateChildren
            (expr_00,(function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&)>
                      *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return (bool)local_39;
}

Assistant:

static bool IsVolatile(LogicalProjection &proj, const unique_ptr<Expression> &expr) {
	if (expr->GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		auto &colref = expr->Cast<BoundColumnRefExpression>();
		D_ASSERT(colref.binding.table_index == proj.table_index);
		D_ASSERT(colref.binding.column_index < proj.expressions.size());
		D_ASSERT(colref.depth == 0);
		if (proj.expressions[colref.binding.column_index]->IsVolatile()) {
			return true;
		}
		return false;
	}
	bool is_volatile = false;
	ExpressionIterator::EnumerateChildren(
	    *expr, [&](unique_ptr<Expression> &child) { is_volatile |= IsVolatile(proj, child); });
	return is_volatile;
}